

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

int __thiscall
reflection::Object::KeyCompareWithValue<std::__cxx11::string>
          (Object *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_name)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)_name);
  uVar2 = 0xffffffff;
  if (iVar1 < 1) {
    uVar2 = std::__cxx11::string::compare((char *)_name);
    uVar2 = uVar2 >> 0x1f;
  }
  return uVar2;
}

Assistant:

int KeyCompareWithValue(const StringType& _name) const {
    if (name()->c_str() < _name) return -1;
    if (_name < name()->c_str()) return 1;
    return 0;
  }